

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

float nite::distancePointToLine(Vec2 *Point,Vec2 *P1,Vec2 *P2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = P1->x;
  fVar2 = P1->y;
  fVar3 = P2->x;
  fVar4 = P2->y;
  fVar8 = fVar3 - fVar1;
  fVar9 = fVar4 - fVar2;
  fVar7 = ((Point->x - fVar1) * fVar8 + (Point->y - fVar2) * fVar9) /
          (fVar9 * fVar9 + fVar8 * fVar8);
  fVar5 = fVar2;
  fVar6 = fVar1;
  if (0.0 <= fVar7) {
    if ((fVar1 == fVar3) && (!NAN(fVar1) && !NAN(fVar3))) {
      if ((fVar2 == fVar4) && (!NAN(fVar2) && !NAN(fVar4))) goto LAB_00189603;
    }
    fVar5 = fVar4;
    fVar6 = fVar3;
    if (fVar7 <= 1.0) {
      fVar5 = fVar9 * fVar7 + fVar2;
      fVar6 = fVar8 * fVar7 + fVar1;
    }
  }
LAB_00189603:
  fVar6 = Point->x - fVar6;
  fVar5 = Point->y - fVar5;
  return SQRT(fVar5 * fVar5 + fVar6 * fVar6);
}

Assistant:

float nite::distancePointToLine(const nite::Vec2 &Point, const nite::Vec2 &P1, const nite::Vec2 &P2){
	float A = Point.x - P1.x;
	float B = Point.y - P1.y;
	float C = P2.x - P1.x;
	float D = P2.y - P1.y;
	float Dot = A*C+B*D;
	float lenSq = nite::pow(C, 2) + nite::pow(D, 2);
	float Param = Dot/lenSq;
	float xx, yy;
	if (Param < 0 || (P1.x == P2.x && P1.y == P2.y)){
		xx = P1.x;
		yy = P1.y;
	}else
	if (Param > 1){
		xx = P2.x;
		yy = P2.y;
	}else{
		xx = P1.x + Param * C;
		yy = P1.y + Param * D;
	}
	float dx = Point.x - xx;
	float dy = Point.y - yy;
	return nite::sqrt(nite::pow(dx, 2) + nite::pow(dy, 2));
}